

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O0

int skynet_send(skynet_context *context,uint32_t source,uint32_t destination,int type,int session,
               void *data,size_t sz)

{
  int iVar1;
  undefined1 local_50 [8];
  skynet_message smsg;
  remote_message *rmsg;
  void *data_local;
  int session_local;
  int type_local;
  uint32_t destination_local;
  uint32_t source_local;
  skynet_context *context_local;
  
  rmsg = (remote_message *)data;
  data_local._0_4_ = session;
  data_local._4_4_ = type;
  session_local = destination;
  type_local = source;
  _destination_local = context;
  if ((sz & 0xffffffffffffff) == sz) {
    _filter_args(context,type,(int *)&data_local,&rmsg,&sz);
    if (type_local == 0) {
      type_local = _destination_local->handle;
    }
    if (session_local == 0) {
      context_local._4_4_ = (int)data_local;
    }
    else {
      iVar1 = skynet_harbor_message_isremote(session_local);
      if (iVar1 == 0) {
        local_50._0_4_ = type_local;
        local_50._4_4_ = (int)data_local;
        smsg._0_8_ = rmsg;
        smsg.data = (void *)sz;
        iVar1 = skynet_context_push(session_local,(skynet_message *)local_50);
        if (iVar1 != 0) {
          free(rmsg);
          return -1;
        }
      }
      else {
        smsg.sz = (size_t)malloc(0x28);
        (((remote_message *)smsg.sz)->destination).handle = session_local;
        ((remote_message *)smsg.sz)->message = rmsg;
        ((remote_message *)smsg.sz)->sz = sz;
        skynet_harbor_send((remote_message *)smsg.sz,type_local,(int)data_local);
      }
      context_local._4_4_ = (int)data_local;
    }
  }
  else {
    skynet_error(context,"The message to %x is too large",(ulong)destination);
    if ((data_local._4_4_ & 0x10000) != 0) {
      free(rmsg);
    }
    context_local._4_4_ = -1;
  }
  return context_local._4_4_;
}

Assistant:

int
skynet_send(struct skynet_context * context, uint32_t source, uint32_t destination , int type, int session, void * data, size_t sz) {
	if ((sz & MESSAGE_TYPE_MASK) != sz) {
		skynet_error(context, "The message to %x is too large", destination);
		if (type & PTYPE_TAG_DONTCOPY) {
			skynet_free(data);
		}
		return -1;
	}
	_filter_args(context, type, &session, (void **)&data, &sz);

	if (source == 0) {
		source = context->handle;
	}

	if (destination == 0) {
		return session;
	}
	if (skynet_harbor_message_isremote(destination)) {
		struct remote_message * rmsg = skynet_malloc(sizeof(*rmsg));
		rmsg->destination.handle = destination;
		rmsg->message = data;
		rmsg->sz = sz;
		skynet_harbor_send(rmsg, source, session);
	} else {
		struct skynet_message smsg;
		smsg.source = source;
		smsg.session = session;
		smsg.data = data;
		smsg.sz = sz;

		if (skynet_context_push(destination, &smsg)) {
			skynet_free(data);
			return -1;
		}
	}
	return session;
}